

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocketengine.cpp
# Opt level: O1

void __thiscall QSocketEngineHandler::~QSocketEngineHandler(QSocketEngineHandler *this)

{
  __pointer_type pQVar1;
  Type *pTVar2;
  QMutex *pQVar3;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *this_00;
  long in_FS_OFFSET;
  bool bVar4;
  QSocketEngineHandler *local_28;
  anon_class_8_1_54a39814_for__M_pred_conflict1 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QSocketEngineHandler = (_func_int **)&PTR__QSocketEngineHandler_002d17f8;
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *)
            this;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>
                       *)this);
  if (pTVar2 == (Type *)0x0) goto LAB_001c5ad5;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
           operator()(this_00);
  pQVar3 = &pTVar2->mutex;
  if ((pTVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar4 = (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar4) goto LAB_001c5a9f;
  }
  else {
LAB_001c5a9f:
    this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *
              )pQVar3;
    QBasicMutex::lockInternal();
  }
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
           operator()(this_00);
  local_28 = this;
  local_20.t = &local_28;
  QtPrivate::
  sequential_erase_if<QList<QSocketEngineHandler*>,QtPrivate::sequential_erase<QList<QSocketEngineHandler*>,QSocketEngineHandler*>(QList<QSocketEngineHandler*>&,QSocketEngineHandler*const&)::_lambda(auto:1_const&)_1_>
            (&pTVar2->super_QList<QSocketEngineHandler_*>,&local_20);
  LOCK();
  pQVar1 = (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar3);
  }
LAB_001c5ad5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSocketEngineHandler::~QSocketEngineHandler()
{
    if (!socketHandlers())
        return;
    QMutexLocker locker(&socketHandlers()->mutex);
    socketHandlers()->removeAll(this);
}